

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofSpring2Constraint.h
# Opt level: O3

char * __thiscall
btGeneric6DofSpring2Constraint::serialize
          (btGeneric6DofSpring2Constraint *this,void *dataBuffer,btSerializer *serializer)

{
  int i_2;
  btTransform *pbVar1;
  btRotationalLimitMotor2 *pbVar2;
  bool *pbVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  
  btTypedConstraint::serialize(&this->super_btTypedConstraint,dataBuffer,serializer);
  pbVar1 = &this->m_frameInA;
  lVar4 = (long)dataBuffer + 0x40;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      *(btScalar *)(lVar4 + lVar6 * 4) = (pbVar1->m_basis).m_el[0].m_floats[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x10;
    pbVar1 = (btTransform *)((pbVar1->m_basis).m_el + 1);
  } while (lVar5 != 3);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x70) = (this->m_frameInA).m_origin.m_floats[lVar4]
    ;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  pbVar1 = &this->m_frameInB;
  lVar4 = (long)dataBuffer + 0x80;
  lVar5 = 0;
  do {
    lVar6 = 0;
    do {
      *(btScalar *)(lVar4 + lVar6 * 4) = (pbVar1->m_basis).m_el[0].m_floats[lVar6];
      lVar6 = lVar6 + 1;
    } while (lVar6 != 4);
    lVar5 = lVar5 + 1;
    lVar4 = lVar4 + 0x10;
    pbVar1 = (btTransform *)((pbVar1->m_basis).m_el + 1);
  } while (lVar5 != 3);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0xb0) = (this->m_frameInB).m_origin.m_floats[lVar4]
    ;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  pbVar2 = this->m_angularLimits;
  lVar4 = -3;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x1c4) = pbVar2->m_loLimit;
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x1b4) = pbVar2->m_hiLimit;
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x1d4) = pbVar2->m_bounce;
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x1e4) = pbVar2->m_stopERP;
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 500) = pbVar2->m_stopCFM;
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x204) = pbVar2->m_motorERP;
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x214) = pbVar2->m_motorCFM;
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x224) = pbVar2->m_targetVelocity;
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x234) = pbVar2->m_maxMotorForce;
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x244) = pbVar2->m_servoTarget;
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x254) = pbVar2->m_springStiffness;
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x264) = pbVar2->m_springDamping;
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x274) = pbVar2->m_equilibriumPoint;
    pbVar2 = pbVar2 + 1;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0);
  *(undefined4 *)((long)dataBuffer + 0x1c4) = 0;
  *(undefined4 *)((long)dataBuffer + 0x1b4) = 0;
  *(undefined4 *)((long)dataBuffer + 0x1d4) = 0;
  *(undefined4 *)((long)dataBuffer + 0x1e4) = 0;
  *(undefined4 *)((long)dataBuffer + 500) = 0;
  *(undefined4 *)((long)dataBuffer + 0x204) = 0;
  *(undefined4 *)((long)dataBuffer + 0x214) = 0;
  *(undefined4 *)((long)dataBuffer + 0x224) = 0;
  *(undefined4 *)((long)dataBuffer + 0x234) = 0;
  *(undefined4 *)((long)dataBuffer + 0x244) = 0;
  *(undefined4 *)((long)dataBuffer + 0x254) = 0;
  *(undefined4 *)((long)dataBuffer + 0x264) = 0;
  *(undefined4 *)((long)dataBuffer + 0x274) = 0;
  pbVar3 = &this->m_angularLimits[0].m_springDampingLimited;
  lVar4 = -3;
  do {
    *(bool *)((long)dataBuffer + lVar4 + 0x27b) = pbVar3[-0x24];
    *(bool *)((long)dataBuffer + lVar4 + 0x27f) = pbVar3[-0x18];
    *(bool *)((long)dataBuffer + lVar4 + 0x283) = pbVar3[-0x10];
    *(bool *)((long)dataBuffer + lVar4 + 0x287) = pbVar3[-8];
    *(bool *)((long)dataBuffer + lVar4 + 0x28b) = *pbVar3;
    pbVar3 = pbVar3 + 0x58;
    lVar4 = lVar4 + 1;
  } while (lVar4 != 0);
  lVar4 = 0;
  *(undefined1 *)((long)dataBuffer + 0x27b) = 0;
  *(undefined1 *)((long)dataBuffer + 0x27f) = 0;
  *(undefined1 *)((long)dataBuffer + 0x283) = 0;
  *(undefined1 *)((long)dataBuffer + 0x287) = 0;
  *(undefined1 *)((long)dataBuffer + 0x28b) = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0xd0) =
         (this->m_linearLimits).m_lowerLimit.m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0xc0) =
         (this->m_linearLimits).m_upperLimit.m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0xe0) =
         (this->m_linearLimits).m_bounce.m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0xf0) =
         (this->m_linearLimits).m_stopERP.m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x100) =
         (this->m_linearLimits).m_stopCFM.m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x110) =
         (this->m_linearLimits).m_motorERP.m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x120) =
         (this->m_linearLimits).m_motorCFM.m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x130) =
         (this->m_linearLimits).m_targetVelocity.m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x140) =
         (this->m_linearLimits).m_maxMotorForce.m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x150) =
         (this->m_linearLimits).m_servoTarget.m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x160) =
         (this->m_linearLimits).m_springStiffness.m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x170) =
         (this->m_linearLimits).m_springDamping.m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(btScalar *)((long)dataBuffer + lVar4 * 4 + 0x180) =
         (this->m_linearLimits).m_equilibriumPoint.m_floats[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 4);
  lVar4 = 0;
  do {
    *(bool *)((long)dataBuffer + lVar4 + 400) = (this->m_linearLimits).m_enableMotor[lVar4];
    *(bool *)((long)dataBuffer + lVar4 + 0x194) = (this->m_linearLimits).m_servoMotor[lVar4];
    *(bool *)((long)dataBuffer + lVar4 + 0x198) = (this->m_linearLimits).m_enableSpring[lVar4];
    *(bool *)((long)dataBuffer + lVar4 + 0x19c) =
         (this->m_linearLimits).m_springStiffnessLimited[lVar4];
    *(bool *)((long)dataBuffer + lVar4 + 0x1a0) =
         (this->m_linearLimits).m_springDampingLimited[lVar4];
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  *(undefined1 *)((long)dataBuffer + 0x193) = 0;
  *(undefined1 *)((long)dataBuffer + 0x197) = 0;
  *(undefined1 *)((long)dataBuffer + 0x19b) = 0;
  *(undefined1 *)((long)dataBuffer + 0x19f) = 0;
  *(undefined1 *)((long)dataBuffer + 0x1a3) = 0;
  *(RotateOrder *)((long)dataBuffer + 0x28c) = this->m_rotateOrder;
  return "btGeneric6DofSpring2ConstraintData";
}

Assistant:

SIMD_FORCE_INLINE const char* btGeneric6DofSpring2Constraint::serialize(void* dataBuffer, btSerializer* serializer) const
{
	btGeneric6DofSpring2ConstraintData2* dof = (btGeneric6DofSpring2ConstraintData2*)dataBuffer;
	btTypedConstraint::serialize(&dof->m_typeConstraintData,serializer);

	m_frameInA.serialize(dof->m_rbAFrame);
	m_frameInB.serialize(dof->m_rbBFrame);

	int i;
	for (i=0;i<3;i++)
	{
		dof->m_angularLowerLimit.m_floats[i]       = m_angularLimits[i].m_loLimit;
		dof->m_angularUpperLimit.m_floats[i]       = m_angularLimits[i].m_hiLimit;
		dof->m_angularBounce.m_floats[i]           = m_angularLimits[i].m_bounce;
		dof->m_angularStopERP.m_floats[i]          = m_angularLimits[i].m_stopERP;
		dof->m_angularStopCFM.m_floats[i]          = m_angularLimits[i].m_stopCFM;
		dof->m_angularMotorERP.m_floats[i]         = m_angularLimits[i].m_motorERP;
		dof->m_angularMotorCFM.m_floats[i]         = m_angularLimits[i].m_motorCFM;
		dof->m_angularTargetVelocity.m_floats[i]   = m_angularLimits[i].m_targetVelocity;
		dof->m_angularMaxMotorForce.m_floats[i]    = m_angularLimits[i].m_maxMotorForce;
		dof->m_angularServoTarget.m_floats[i]      = m_angularLimits[i].m_servoTarget;
		dof->m_angularSpringStiffness.m_floats[i]  = m_angularLimits[i].m_springStiffness;
		dof->m_angularSpringDamping.m_floats[i]    = m_angularLimits[i].m_springDamping;
		dof->m_angularEquilibriumPoint.m_floats[i] = m_angularLimits[i].m_equilibriumPoint;
	}
	dof->m_angularLowerLimit.m_floats[3]       = 0;
	dof->m_angularUpperLimit.m_floats[3]       = 0;
	dof->m_angularBounce.m_floats[3]           = 0;
	dof->m_angularStopERP.m_floats[3]          = 0;
	dof->m_angularStopCFM.m_floats[3]          = 0;
	dof->m_angularMotorERP.m_floats[3]         = 0;
	dof->m_angularMotorCFM.m_floats[3]         = 0;
	dof->m_angularTargetVelocity.m_floats[3]   = 0;
	dof->m_angularMaxMotorForce.m_floats[3]    = 0;
	dof->m_angularServoTarget.m_floats[3]      = 0;
	dof->m_angularSpringStiffness.m_floats[3]  = 0;
	dof->m_angularSpringDamping.m_floats[3]    = 0;
	dof->m_angularEquilibriumPoint.m_floats[3] = 0;
	for (i=0;i<4;i++)
	{
		dof->m_angularEnableMotor[i]            = i < 3 ? ( m_angularLimits[i].m_enableMotor ? 1 : 0 ) : 0;
		dof->m_angularServoMotor[i]             = i < 3 ? ( m_angularLimits[i].m_servoMotor ? 1 : 0 ) : 0;
		dof->m_angularEnableSpring[i]           = i < 3 ? ( m_angularLimits[i].m_enableSpring ? 1 : 0 ) : 0;
		dof->m_angularSpringStiffnessLimited[i] = i < 3 ? ( m_angularLimits[i].m_springStiffnessLimited ? 1 : 0 ) : 0;
		dof->m_angularSpringDampingLimited[i]   = i < 3 ? ( m_angularLimits[i].m_springDampingLimited ? 1 : 0 ) : 0;
	}

	m_linearLimits.m_lowerLimit.serialize( dof->m_linearLowerLimit );
	m_linearLimits.m_upperLimit.serialize( dof->m_linearUpperLimit );
	m_linearLimits.m_bounce.serialize( dof->m_linearBounce );
	m_linearLimits.m_stopERP.serialize( dof->m_linearStopERP );
	m_linearLimits.m_stopCFM.serialize( dof->m_linearStopCFM );
	m_linearLimits.m_motorERP.serialize( dof->m_linearMotorERP );
	m_linearLimits.m_motorCFM.serialize( dof->m_linearMotorCFM );
	m_linearLimits.m_targetVelocity.serialize( dof->m_linearTargetVelocity );
	m_linearLimits.m_maxMotorForce.serialize( dof->m_linearMaxMotorForce );
	m_linearLimits.m_servoTarget.serialize( dof->m_linearServoTarget );
	m_linearLimits.m_springStiffness.serialize( dof->m_linearSpringStiffness );
	m_linearLimits.m_springDamping.serialize( dof->m_linearSpringDamping );
	m_linearLimits.m_equilibriumPoint.serialize( dof->m_linearEquilibriumPoint );
	for (i=0;i<4;i++)
	{
		dof->m_linearEnableMotor[i]            = i < 3 ? ( m_linearLimits.m_enableMotor[i] ? 1 : 0 ) : 0;
		dof->m_linearServoMotor[i]             = i < 3 ? ( m_linearLimits.m_servoMotor[i] ? 1 : 0 ) : 0;
		dof->m_linearEnableSpring[i]           = i < 3 ? ( m_linearLimits.m_enableSpring[i] ? 1 : 0 ) : 0;
		dof->m_linearSpringStiffnessLimited[i] = i < 3 ? ( m_linearLimits.m_springStiffnessLimited[i] ? 1 : 0 ) : 0;
		dof->m_linearSpringDampingLimited[i]   = i < 3 ? ( m_linearLimits.m_springDampingLimited[i] ? 1 : 0 ) : 0;
	}

	dof->m_rotateOrder = m_rotateOrder;

	return btGeneric6DofSpring2ConstraintDataName;
}